

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::ApprovalTestNamer::getTestSourceDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  pointer pcVar1;
  TestName *pTVar2;
  string file;
  string local_38;
  
  pTVar2 = getCurrentTest();
  TestName::checkBuildConfiguration((string *)&pTVar2->fileName);
  pcVar1 = (pTVar2->fileName)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (pTVar2->fileName)._M_string_length);
  FileUtils::getDirectory(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getTestSourceDirectory() const
    {
        auto file = getCurrentTest().getFileName();
        return FileUtils::getDirectory(file);
    }